

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle_monte_carlo.cpp
# Opt level: O2

double triangle01_monomial_integral(int *e)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  double dVar7;
  double dVar8;
  
  if ((-1 < *e) && (-1 < e[1])) {
    dVar7 = 1.0;
    iVar1 = 0;
    for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
      iVar2 = e[lVar3];
      if (iVar2 < 1) {
        iVar2 = 0;
      }
      dVar8 = 1.0;
      iVar5 = iVar2;
      iVar4 = iVar1;
      while( true ) {
        iVar4 = iVar4 + 1;
        bVar6 = iVar5 == 0;
        iVar5 = iVar5 + -1;
        if (bVar6) break;
        dVar7 = (dVar7 * dVar8) / (double)iVar4;
        dVar8 = dVar8 + 1.0;
      }
      iVar1 = iVar1 + iVar2;
    }
    for (iVar2 = 0; iVar2 != 2; iVar2 = iVar2 + 1) {
      dVar7 = dVar7 / (double)(iVar1 + 1 + iVar2);
    }
    return dVar7;
  }
  std::operator<<((ostream *)&std::cerr,"\n");
  std::operator<<((ostream *)&std::cerr,"TRIANGLE01_MONOMIAL_INTEGRAL - Fatal error!\n");
  std::operator<<((ostream *)&std::cerr,"  All exponents must be nonnegative.\n");
  exit(1);
}

Assistant:

double triangle01_monomial_integral ( int e[] )

//****************************************************************************80
//
//  Purpose:
//
//    TRIANGLE01_MONOMIAL_INTEGRAL: monomial integrals in the unit triangle in 2D.
//
//  Discussion:
//
//    The monomial is F(X,Y) = X^E(1) * Y^E(2).
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    13 January 2014
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int E[2], the exponents.  
//    Each exponent must be nonnegative.
//
//    Output, double TRIANGLE01_MONOMIAL_INTEGRAL, the integral.
//
{
  int i;
  double integral;
  int j;
  int k;
  const int m = 2;

  for ( i = 0; i < m; i++ )
  {
    if ( e[i] < 0 )
    {
      std::cerr << "\n";
      std::cerr << "TRIANGLE01_MONOMIAL_INTEGRAL - Fatal error!\n";
      std::cerr << "  All exponents must be nonnegative.\n";
      exit ( 1 );
    }
  }

  k = 0;
  integral = 1.0;

  for ( i = 0; i < m; i++ )
  {
    for ( j = 1; j <= e[i]; j++ )
    {
      k = k + 1;
      integral = integral * double( j ) / double( k );
    }
  }

  for ( i = 0; i < m; i++ )
  {
    k = k + 1;
    integral = integral / double( k );
  }

  return integral;
}